

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2r2rect.cc
# Opt level: O3

bool __thiscall S2R2Rect::Contains(S2R2Rect *this,S2Point *p)

{
  int b;
  byte bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  S2LogMessage local_20;
  
  dVar4 = (double)((ulong)p->c_[0] & (ulong)DAT_0023a090);
  auVar5 = *(undefined1 (*) [16])(p->c_ + 1) & _DAT_0023a090;
  dVar6 = auVar5._8_8_;
  dVar3 = auVar5._0_8_;
  b = (dVar3 <= dVar6) + 1;
  if (dVar3 < dVar4) {
    b = (uint)(dVar4 <= dVar6) * 2;
  }
  dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                    ((BasicVector<Vector3,_double,_3UL> *)p,b);
  bVar1 = 0;
  if (((dVar3 < dVar4) && (dVar6 < dVar4)) && (0.0 <= dVar2)) {
    dVar6 = p->c_[0];
    if (p->c_[2] * (double)0 + dVar6 * (double)0x3ff0000000000000 + 0.0 + p->c_[1] * (double)0 <=
        0.0) {
      S2LogMessage::S2LogMessage
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2coords.h"
                 ,0x16d,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_20.stream_,"Check failed: (p.DotProd(GetNorm(face))) > (0) ",0x2f);
      abort();
    }
    dVar4 = p->c_[1] / dVar6;
    dVar6 = p->c_[2] / dVar6;
    dVar3 = dVar4 * 3.0;
    if (0.0 <= dVar4) {
      dVar3 = dVar3 + 1.0;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar3 = dVar3 * 0.5;
    }
    else {
      dVar3 = 1.0 - dVar3;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar3 = dVar3 * -0.5 + 1.0;
    }
    dVar4 = dVar6 * 3.0;
    if (0.0 <= dVar6) {
      dVar4 = dVar4 + 1.0;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar4 = dVar4 * 0.5;
    }
    else {
      dVar4 = 1.0 - dVar4;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar4 = dVar4 * -0.5 + 1.0;
    }
    bVar1 = 0;
    if (((this->rect_).bounds_[0].bounds_.c_[0] <= dVar3) &&
       (dVar3 <= (this->rect_).bounds_[0].bounds_.c_[1])) {
      bVar1 = -(dVar4 <= (this->rect_).bounds_[1].bounds_.c_[1]) &
              -((this->rect_).bounds_[1].bounds_.c_[0] <= dVar4);
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool S2R2Rect::Contains(const S2Point& p) const {
  if (S2::GetFace(p) != 0) return false;
  double u, v;
  S2::ValidFaceXYZtoUV(0, p, &u, &v);
  return Contains(R2Point(S2::UVtoST(u), S2::UVtoST(v)));
}